

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O3

long __thiscall gl4cts::BasicUsageNoOffset::Cleanup(BasicUsageNoOffset *this)

{
  CallLogWrapper *this_00;
  GLsizei width;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glDeleteFramebuffers(this_00,1,&this->fbo_);
  glu::CallLogWrapper::glDeleteTextures(this_00,2,this->rt_);
  iVar1 = (*((this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.m_context)->m_renderCtx
            ->_vptr_RenderContext[4])();
  width = *(GLsizei *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*((this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.m_context)->m_renderCtx
            ->_vptr_RenderContext[4])();
  glu::CallLogWrapper::glViewport
            (this_00,0,0,width,*(GLsizei *)(CONCAT44(extraout_var_00,iVar1) + 4));
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->counter_buffer_);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&this->vao_);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->vbo_);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->prog_);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glDeleteFramebuffers(1, &fbo_);
		glDeleteTextures(2, rt_);
		glViewport(0, 0, getWindowWidth(), getWindowHeight());
		glDeleteBuffers(1, &counter_buffer_);
		glDeleteVertexArrays(1, &vao_);
		glDeleteBuffers(1, &vbo_);
		glDeleteProgram(prog_);
		glUseProgram(0);
		return NO_ERROR;
	}